

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_node __thiscall
pugi::xml_node::insert_move_before(xml_node *this,xml_node *moved,xml_node *node)

{
  ulong *puVar1;
  xml_node_struct *pxVar2;
  xml_node_struct *pxVar3;
  xml_node_struct *node_00;
  bool bVar4;
  xml_node unaff_RBX;
  xml_node in_stack_ffffffffffffffe0;
  
  bVar4 = impl::anon_unknown_0::allow_move(unaff_RBX,in_stack_ffffffffffffffe0);
  if ((((bVar4) && (pxVar2 = node->_root, pxVar2 != (xml_node_struct *)0x0)) &&
      (pxVar3 = this->_root, pxVar2->parent == pxVar3)) &&
     (node_00 = moved->_root, node_00 != pxVar2)) {
    puVar1 = (ulong *)(*(long *)((long)pxVar3 - (pxVar3->header >> 8)) + -0x40);
    *puVar1 = *puVar1 | 0x40;
    impl::anon_unknown_0::remove_node(node_00);
    impl::anon_unknown_0::insert_node_before(moved->_root,node->_root);
    in_stack_ffffffffffffffe0 = (xml_node)moved->_root;
  }
  else {
    xml_node((xml_node *)&stack0xffffffffffffffe0);
  }
  return (xml_node)in_stack_ffffffffffffffe0._root;
}

Assistant:

PUGI_IMPL_FN xml_node xml_node::insert_move_before(const xml_node& moved, const xml_node& node)
	{
		if (!impl::allow_move(*this, moved)) return xml_node();
		if (!node._root || node._root->parent != _root) return xml_node();
		if (moved._root == node._root) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		// disable document_buffer_order optimization since moving nodes around changes document order without changing buffer pointers
		impl::get_document(_root).header |= impl::xml_memory_page_contents_shared_mask;

		impl::remove_node(moved._root);
		impl::insert_node_before(moved._root, node._root);

		return moved;
	}